

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSS.cpp
# Opt level: O1

void __thiscall NaPNStateSpace::action(NaPNStateSpace *this)

{
  NaStateSpaceModel *pNVar1;
  int iVar2;
  int iVar3;
  NaVector *pNVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 *puVar5;
  
  if (this->m_pSSModel == (NaStateSpaceModel *)0x0) {
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0;
    __cxa_throw(puVar5,&NaException::typeinfo,0);
  }
  if ((this->super_NaPetriNode).bVerbose == true) {
    NaPrintLog(
              "           *************************\n           * Internal state change *\n           *************************\n"
              );
    NaPrintLog("### x(t): ");
    pNVar4 = NaPetriCnOutput::data(&this->x);
    (*pNVar4->_vptr_NaVector[0x1f])(pNVar4);
    NaPrintLog("### y(t): ");
    pNVar4 = NaPetriCnOutput::data(&this->y);
    (*pNVar4->_vptr_NaVector[0x1f])(pNVar4);
  }
  pNVar1 = this->m_pSSModel;
  pNVar4 = NaPetriCnInput::data(&this->u);
  iVar2 = (*pNVar4->_vptr_NaVector[8])(pNVar4,0);
  pNVar4 = NaPetriCnOutput::data(&this->y);
  iVar3 = (*pNVar4->_vptr_NaVector[8])(pNVar4,0);
  (*(pNVar1->super_NaUnit).super_NaLogging._vptr_NaLogging[6])
            (pNVar1,CONCAT44(extraout_var,iVar2),CONCAT44(extraout_var_00,iVar3));
  pNVar1 = this->m_pSSModel;
  pNVar4 = NaPetriCnOutput::data(&this->x);
  (*(pNVar1->super_NaUnit).super_NaLogging._vptr_NaLogging[0x17])(pNVar1,pNVar4);
  if ((this->super_NaPetriNode).bVerbose == true) {
    NaPrintLog("### x(t+1): ");
    pNVar4 = NaPetriCnOutput::data(&this->x);
    (*pNVar4->_vptr_NaVector[0x1f])(pNVar4);
    return;
  }
  return;
}

Assistant:

void
NaPNStateSpace::action ()
{
    if(NULL == m_pSSModel){
      throw(na_null_pointer);
    }

    //           *************************
    //           * Internal state change *
    //           *************************

    if(bVerbose){
        NaPrintLog("           *************************\n"
                   "           * Internal state change *\n"
                   "           *************************\n");

        NaPrintLog("### x(t): ");
        x.data().print_contents();

        NaPrintLog("### y(t): ");
        y.data().print_contents();
    }

    m_pSSModel->Function(&u.data()[0], &y.data()[0]);
    m_pSSModel->GetState(x.data());

    if(bVerbose){
        NaPrintLog("### x(t+1): ");
        x.data().print_contents();
    }
}